

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdFinalizeMultisigSign
              (void *handle,void *multisign_handle,int net_type,char *tx_hex_string,char *txid,
              uint32_t vout,int hash_type,char *redeem_script,char **tx_string)

{
  long lVar1;
  bool bVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *in_RCX;
  ulong uVar5;
  long in_RSI;
  ConfidentialTransactionContext *in_R8;
  uint32_t in_R9D;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_stack_00000010;
  undefined8 *in_stack_00000018;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext tx_1;
  TransactionContext tx;
  Script script;
  OutPoint outpoint;
  bool is_bitcoin;
  string pubkey;
  SignParameter param;
  uint32_t index;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_list;
  CfdCapiMultisigSignData *data;
  Script redeem_script_obj;
  Script witness_script_obj;
  AddressType addr_type;
  string *in_stack_fffffffffffff688;
  ConfidentialTransactionContext *in_stack_fffffffffffff690;
  value_type *in_stack_fffffffffffff698;
  string *in_stack_fffffffffffff6a0;
  ByteData *in_stack_fffffffffffff6a8;
  CfdError CVar6;
  SignParameter *in_stack_fffffffffffff6b0;
  allocator *paVar7;
  undefined8 in_stack_fffffffffffff6c0;
  AddressType AVar8;
  Script *in_stack_fffffffffffff6c8;
  Script *redeem_script_00;
  OutPoint *outpoint_00;
  bool *in_stack_fffffffffffff6e8;
  undefined4 in_stack_fffffffffffff6f0;
  uint in_stack_fffffffffffff6f4;
  string *in_stack_fffffffffffff798;
  undefined7 in_stack_fffffffffffff7a0;
  undefined1 in_stack_fffffffffffff7a7;
  string local_808;
  allocator local_7e1;
  string local_7e0 [32];
  AbstractTransaction local_7c0 [11];
  string local_708;
  undefined1 local_6e1 [33];
  AbstractTransaction local_6c0 [11];
  OutPoint local_601 [2];
  allocator local_5a1;
  string local_5a0;
  Txid local_580;
  OutPoint local_560;
  byte local_531;
  Pubkey local_530;
  ByteData local_518;
  allocator local_4f9;
  string local_4f8;
  allocator local_4d1;
  string local_4d0;
  ByteData local_4b0 [6];
  uint local_41c;
  undefined1 local_3fa;
  allocator local_3f9;
  string local_3f8 [32];
  CfdSourceLocation local_3d8;
  undefined1 local_3ba;
  allocator local_3b9;
  string local_3b8 [32];
  CfdSourceLocation local_398;
  long local_380;
  undefined1 local_372;
  allocator local_371;
  string local_370 [32];
  CfdSourceLocation local_350;
  Script local_338;
  allocator local_2f9;
  string local_2f8;
  Script local_2d8;
  allocator local_299;
  string local_298;
  Script local_278;
  allocator local_239;
  string local_238;
  Script local_218;
  Script local_1e0;
  Script local_1a8;
  AddressType local_170;
  undefined1 local_16a;
  allocator local_169;
  string local_168 [32];
  CfdSourceLocation local_148;
  undefined1 local_12a;
  allocator local_129;
  string local_128 [32];
  CfdSourceLocation local_108;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [32];
  CfdSourceLocation local_c8;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [32];
  CfdSourceLocation local_88;
  allocator local_69;
  string local_68 [52];
  uint32_t local_34;
  ConfidentialTransactionContext *local_30;
  char *local_28;
  long local_18;
  int local_4;
  
  local_34 = in_R9D;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"MultisigSign",&local_69);
  cfd::capi::CheckBuffer
            ((void *)CONCAT17(in_stack_fffffffffffff7a7,in_stack_fffffffffffff7a0),
             in_stack_fffffffffffff798);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  bVar2 = cfd::capi::IsEmptyString(local_28);
  if (bVar2) {
    local_88.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    CVar6 = (CfdError)((ulong)in_stack_fffffffffffff6a8 >> 0x20);
    local_88.filename = local_88.filename + 1;
    local_88.line = 2000;
    local_88.funcname = "CfdFinalizeMultisigSign";
    cfd::core::logger::warn<>(&local_88,"tx is null or empty.");
    local_aa = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"Failed to parameter. tx is null or empty.",&local_a9);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff6b0,CVar6,in_stack_fffffffffffff6a0);
    local_aa = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString((char *)local_30);
  if (bVar2) {
    local_c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    CVar6 = (CfdError)((ulong)in_stack_fffffffffffff6a8 >> 0x20);
    local_c8.filename = local_c8.filename + 1;
    local_c8.line = 0x7d6;
    local_c8.funcname = "CfdFinalizeMultisigSign";
    cfd::core::logger::warn<>(&local_c8,"txid is null or empty.");
    local_ea = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"Failed to parameter. txid is null or empty.",&local_e9);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff6b0,CVar6,in_stack_fffffffffffff6a0);
    local_ea = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString((char *)in_stack_00000010);
  if (bVar2) {
    local_108.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    CVar6 = (CfdError)((ulong)in_stack_fffffffffffff6a8 >> 0x20);
    local_108.filename = local_108.filename + 1;
    local_108.line = 0x7dc;
    local_108.funcname = "CfdFinalizeMultisigSign";
    cfd::core::logger::warn<>(&local_108,"redeemScript is null or empty.");
    local_12a = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    paVar7 = &local_129;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_128,"Failed to parameter. redeemScript is null or empty.",paVar7);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff6b0,CVar6,in_stack_fffffffffffff6a0);
    local_12a = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000018 != (undefined8 *)0x0) {
    local_170 = cfd::capi::ConvertHashToAddressType(in_stack_fffffffffffff6f4);
    cfd::core::Script::Script(&local_1a8);
    cfd::core::Script::Script(&local_1e0);
    if (local_170 == kP2shAddress) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_238,(char *)in_stack_00000010,&local_239);
      cfd::core::Script::Script(&local_218,&local_238);
      cfd::core::Script::operator=(&local_1e0,&local_218);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff690);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator((allocator<char> *)&local_239);
    }
    else if (local_170 == kP2wshAddress) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_298,(char *)in_stack_00000010,&local_299);
      cfd::core::Script::Script(&local_278,&local_298);
      cfd::core::Script::operator=(&local_1a8,&local_278);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff690);
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator((allocator<char> *)&local_299);
    }
    else {
      if (local_170 != kP2shP2wshAddress) {
        local_350.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                     ,0x2f);
        CVar6 = (CfdError)((ulong)in_stack_fffffffffffff6a8 >> 0x20);
        local_350.filename = local_350.filename + 1;
        local_350.line = 0x7f8;
        local_350.funcname = "CfdFinalizeMultisigSign";
        cfd::core::logger::warn<>(&local_350,"pkh is not target.");
        local_372 = 1;
        uVar3 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_370,"Failed to parameter. hash type cannot used pkh target.",&local_371);
        cfd::core::CfdException::CfdException
                  ((CfdException *)in_stack_fffffffffffff6b0,CVar6,in_stack_fffffffffffff6a0);
        local_372 = 0;
        __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
        ;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2f8,(char *)in_stack_00000010,&local_2f9);
      cfd::core::Script::Script(&local_2d8,&local_2f8);
      cfd::core::Script::operator=(&local_1a8,&local_2d8);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff690);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      cfd::core::ScriptUtil::CreateP2shLockingScript(&local_338,&local_1a8);
      cfd::core::Script::operator=(&local_1e0,&local_338);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff690);
    }
    local_380 = local_18;
    if (*(int *)(local_18 + 0x15c8) != 0) {
      if (*(uint *)(local_18 + 0x15c8) < 0x15) {
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
                  ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)0x61b089);
        for (local_41c = 0; AVar8 = (AddressType)((ulong)in_stack_fffffffffffff6c0 >> 0x20),
            local_41c < *(uint *)(local_380 + 0x15c8); local_41c = local_41c + 1) {
          uVar5 = (ulong)local_41c;
          lVar1 = local_380 + 0x10;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_4d0,(char *)(lVar1 + uVar5 * 0x93),&local_4d1);
          cfd::core::ByteData::ByteData(local_4b0,&local_4d0);
          cfd::SignParameter::SignParameter(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
          cfd::core::ByteData::~ByteData((ByteData *)0x61b141);
          std::__cxx11::string::~string((string *)&local_4d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
          uVar5 = (ulong)local_41c;
          lVar1 = local_380 + 0xb8c;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_4f8,(char *)(lVar1 + uVar5 * 0x83),&local_4f9);
          std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
          cfd::core::ByteData::ByteData(&local_518,&local_4f8);
          bVar2 = cfd::core::Pubkey::IsValid(&local_518);
          in_stack_fffffffffffff6f4 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff6f4);
          cfd::core::ByteData::~ByteData((ByteData *)0x61b1ed);
          if ((in_stack_fffffffffffff6f4 & 0x1000000) != 0) {
            cfd::core::Pubkey::Pubkey(&local_530,&local_4f8);
            cfd::SignParameter::SetRelatedPubkey
                      ((SignParameter *)in_stack_fffffffffffff690,
                       (Pubkey *)in_stack_fffffffffffff688);
            cfd::core::Pubkey::~Pubkey((Pubkey *)0x61b235);
          }
          std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                    ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                     in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
          std::__cxx11::string::~string((string *)&local_4f8);
          cfd::SignParameter::~SignParameter((SignParameter *)in_stack_fffffffffffff690);
        }
        local_531 = 0;
        cfd::capi::ConvertNetType(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6e8);
        paVar7 = &local_5a1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_5a0,(char *)local_30,paVar7);
        cfd::core::Txid::Txid(&local_580,&local_5a0);
        cfd::core::OutPoint::OutPoint(&local_560,&local_580,local_34);
        cfd::core::Txid::~Txid((Txid *)0x61b429);
        std::__cxx11::string::~string((string *)&local_5a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
        outpoint_00 = local_601;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)((long)&local_601[0].txid_._vptr_Txid + 1),(char *)in_stack_00000010,
                   (allocator *)outpoint_00);
        cfd::core::Script::Script
                  ((Script *)((long)&local_601[0].vout_ + 1),
                   (string *)((long)&local_601[0].txid_._vptr_Txid + 1));
        std::__cxx11::string::~string((string *)((long)&local_601[0].txid_._vptr_Txid + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_601);
        if ((local_531 & 1) == 0) {
          paVar7 = &local_7e1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_7e0,local_28,paVar7);
          cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                    (in_stack_fffffffffffff690,in_stack_fffffffffffff688);
          std::__cxx11::string::~string(local_7e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
          cfd::ConfidentialTransactionContext::AddMultisigSign
                    (local_30,outpoint_00,in_stack_00000010,in_stack_fffffffffffff6c8,AVar8);
          cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_808,local_7c0);
          in_stack_fffffffffffff6a0 =
               (string *)
               cfd::capi::CreateString
                         ((string *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
          *in_stack_00000018 = in_stack_fffffffffffff6a0;
          std::__cxx11::string::~string((string *)&local_808);
          cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                    (in_stack_fffffffffffff690);
        }
        else {
          redeem_script_00 = (Script *)local_6e1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_6e1 + 1),local_28,(allocator *)redeem_script_00);
          AVar8 = (AddressType)((ulong)local_28 >> 0x20);
          cfd::TransactionContext::TransactionContext
                    ((TransactionContext *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
          std::__cxx11::string::~string((string *)(local_6e1 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_6e1);
          cfd::TransactionContext::AddMultisigSign
                    ((TransactionContext *)local_30,outpoint_00,in_stack_00000010,redeem_script_00,
                     AVar8);
          cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_708,local_6c0);
          pcVar4 = cfd::capi::CreateString
                             ((string *)
                              CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
          *in_stack_00000018 = pcVar4;
          std::__cxx11::string::~string((string *)&local_708);
          cfd::TransactionContext::~TransactionContext
                    ((TransactionContext *)in_stack_fffffffffffff690);
        }
        local_4 = 0;
        cfd::core::Script::~Script((Script *)in_stack_fffffffffffff690);
        cfd::core::OutPoint::~OutPoint((OutPoint *)0x61b8b2);
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
                  ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                   in_stack_fffffffffffff6a0);
        cfd::core::Script::~Script((Script *)in_stack_fffffffffffff690);
        cfd::core::Script::~Script((Script *)in_stack_fffffffffffff690);
        return local_4;
      }
      local_3d8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                   ,0x2f);
      CVar6 = (CfdError)((ulong)in_stack_fffffffffffff6a8 >> 0x20);
      local_3d8.filename = local_3d8.filename + 1;
      local_3d8.line = 0x807;
      local_3d8.funcname = "CfdFinalizeMultisigSign";
      cfd::core::logger::warn<>(&local_3d8,"The number of signature has reached the upper limit.");
      local_3fa = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3f8,"The number of signature has reached the upper limit.",&local_3f9);
      cfd::core::CfdException::CfdException
                ((CfdException *)in_stack_fffffffffffff6b0,CVar6,in_stack_fffffffffffff6a0);
      local_3fa = 0;
      __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    local_398.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    CVar6 = (CfdError)((ulong)in_stack_fffffffffffff6a8 >> 0x20);
    local_398.filename = local_398.filename + 1;
    local_398.line = 0x801;
    local_398.funcname = "CfdFinalizeMultisigSign";
    cfd::core::logger::warn<>(&local_398,"The signature has empty.");
    local_3ba = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b8,"The signature has empty.",&local_3b9);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff6b0,CVar6,in_stack_fffffffffffff6a0);
    local_3ba = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_148.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
               ,0x2f);
  CVar6 = (CfdError)((ulong)in_stack_fffffffffffff6a8 >> 0x20);
  local_148.filename = local_148.filename + 1;
  local_148.line = 0x7e2;
  local_148.funcname = "CfdFinalizeMultisigSign";
  cfd::core::logger::warn<>(&local_148,"tx output is null.");
  local_16a = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"Failed to parameter. tx output is null.",&local_169);
  cfd::core::CfdException::CfdException
            ((CfdException *)in_stack_fffffffffffff6b0,CVar6,in_stack_fffffffffffff6a0);
  local_16a = 0;
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdFinalizeMultisigSign(
    void* handle, void* multisign_handle, int net_type,
    const char* tx_hex_string, const char* txid, uint32_t vout, int hash_type,
    const char* redeem_script, char** tx_string) {
  try {
    cfd::Initialize();
    CheckBuffer(multisign_handle, kPrefixMultisigSignData);
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(redeem_script)) {
      warn(CFD_LOG_SOURCE, "redeemScript is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. redeemScript is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    Script witness_script_obj;
    Script redeem_script_obj;
    switch (addr_type) {
      case AddressType::kP2shAddress:
        redeem_script_obj = Script(std::string(redeem_script));
        break;
      case AddressType::kP2wshAddress:
        witness_script_obj = Script(std::string(redeem_script));
        break;
      case AddressType::kP2shP2wshAddress:
        witness_script_obj = Script(std::string(redeem_script));
        redeem_script_obj =
            ScriptUtil::CreateP2shLockingScript(witness_script_obj);
        break;
      default:
        warn(CFD_LOG_SOURCE, "pkh is not target.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. hash type cannot used pkh target.");
    }

    CfdCapiMultisigSignData* data =
        static_cast<CfdCapiMultisigSignData*>(multisign_handle);
    if (data->current_index == 0) {
      warn(CFD_LOG_SOURCE, "The signature has empty.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError, "The signature has empty.");
    }
    if (data->current_index > kMultisigMaxKeyNum) {
      warn(
          CFD_LOG_SOURCE,
          "The number of signature has reached the upper limit.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "The number of signature has reached the upper limit.");
    }

    std::vector<SignParameter> sign_list;
    for (uint32_t index = 0; index < data->current_index; ++index) {
      SignParameter param(ByteData(std::string(data->signatures[index])));
      std::string pubkey(data->pubkeys[index]);
      if (Pubkey::IsValid(ByteData(pubkey))) {
        param.SetRelatedPubkey(Pubkey(pubkey));
      }
      sign_list.push_back(param);
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    OutPoint outpoint(Txid(txid), vout);
    Script script = Script(std::string(redeem_script));
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      tx.AddMultisigSign(outpoint, sign_list, script, addr_type);
      *tx_string = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      tx.AddMultisigSign(outpoint, sign_list, script, addr_type);
      *tx_string = CreateString(tx.GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}